

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

void Abc_NtkPrintGates(Abc_Ntk_t *pNtk,int fUseLibrary,int fUpdateProfile)

{
  int iVar1;
  Abc_NtkFunc_t AVar2;
  long *plVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Mio_Gate_t **ppMVar10;
  Abc_Obj_t *pAVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  Mio_Gate_t *pMVar15;
  Vec_Ptr_t *pVVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  double dVar24;
  double dVar25;
  int local_60;
  uint local_5c;
  uint local_3c;
  
  AVar2 = pNtk->ntkFunc;
  if (AVar2 == ABC_FUNC_MAP && fUseLibrary != 0) {
    uVar4 = Mio_LibraryReadGateNum((Mio_Library_t *)pNtk->pManFunc);
    ppMVar10 = Mio_LibraryReadGateArray((Mio_Library_t *)pNtk->pManFunc);
    uVar17 = (ulong)uVar4;
    if (0 < (int)uVar4) {
      uVar21 = 0;
      do {
        Mio_GateSetValue(ppMVar10[uVar21],0);
        if (fUpdateProfile != 0) {
          Mio_GateSetProfile2(ppMVar10[uVar21],0);
        }
        uVar21 = uVar21 + 1;
      } while (uVar17 != uVar21);
    }
    pVVar16 = pNtk->vObjs;
    if (pVVar16->nSize < 1) {
      local_5c = 0;
    }
    else {
      uVar21 = 0;
      local_5c = 0;
      do {
        iVar20 = (int)uVar21;
        pAVar11 = (Abc_Obj_t *)pVVar16->pArray[uVar21];
        if ((pAVar11 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar11->field_0x14 & 0xf) == 7)) {
          if ((pAVar11->pNtk->ntkFunc == ABC_FUNC_MAP) && ((pAVar11->vFanins).nSize == 1)) {
            bVar22 = (pAVar11->field_5).pData == (void *)0x0;
          }
          else {
            bVar22 = false;
          }
          if ((iVar20 != 0) && (!bVar22)) {
            pMVar15 = (Mio_Gate_t *)(pAVar11->field_5).pData;
            iVar5 = Mio_GateReadValue(pMVar15);
            Mio_GateSetValue(pMVar15,iVar5 + 1);
            if (fUpdateProfile != 0) {
              Mio_GateIncProfile2((Mio_Gate_t *)(pAVar11->field_5).pData);
            }
            local_5c = local_5c + 1;
            pAVar11 = Abc_NtkFetchTwinNode(pAVar11);
            iVar20 = (iVar20 + 1) - (uint)(pAVar11 == (Abc_Obj_t *)0x0);
            pVVar16 = pNtk->vObjs;
          }
        }
        uVar21 = (ulong)(iVar20 + 1U);
      } while ((int)(iVar20 + 1U) < pVVar16->nSize);
    }
    if ((int)uVar4 < 1) {
      dVar24 = Abc_NtkGetMappedArea(pNtk);
      uVar17 = 0;
      uVar19 = 5;
    }
    else {
      uVar19 = 5;
      uVar21 = 0;
      do {
        iVar20 = Mio_GateReadValue(ppMVar10[uVar21]);
        uVar6 = uVar19;
        if (iVar20 != 0) {
          pcVar12 = Mio_GateReadName(ppMVar10[uVar21]);
          sVar13 = strlen(pcVar12);
          uVar6 = (uint)sVar13;
          if ((int)(uint)sVar13 < (int)uVar19) {
            uVar6 = uVar19;
          }
        }
        uVar19 = uVar6;
        uVar21 = uVar21 + 1;
      } while (uVar17 != uVar21);
      dVar24 = Abc_NtkGetMappedArea(pNtk);
      if ((int)uVar4 < 1) {
        uVar17 = 0;
      }
      else {
        uVar21 = 0;
        local_3c = 0;
        do {
          uVar4 = Mio_GateReadValue(ppMVar10[uVar21]);
          if ((uVar4 != 0) || (iVar20 = Mio_GateReadProfile(ppMVar10[uVar21]), iVar20 != 0)) {
            iVar20 = Mio_GateReadPinNum(ppMVar10[uVar21]);
            if (1 < iVar20) {
              iVar5 = Mio_GateReadProfile(ppMVar10[uVar21]);
              iVar20 = Mio_GateReadProfile2(ppMVar10[uVar21]);
              iVar5 = iVar5 - iVar20;
              iVar20 = -iVar5;
              if (0 < iVar5) {
                iVar20 = iVar5;
              }
              local_3c = local_3c + iVar20;
            }
            dVar25 = Mio_GateReadArea(ppMVar10[uVar21]);
            pcVar12 = Mio_GateReadName(ppMVar10[uVar21]);
            uVar6 = Mio_GateReadPinNum(ppMVar10[uVar21]);
            uVar7 = Mio_GateReadProfile(ppMVar10[uVar21]);
            uVar8 = Mio_GateReadProfile2(ppMVar10[uVar21]);
            pcVar14 = Mio_GateReadForm(ppMVar10[uVar21]);
            printf("%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%   %8d  %8d   %s\n"
                   ,dVar25 * (double)(int)uVar4,(dVar25 * (double)(int)uVar4 * 100.0) / dVar24,
                   (ulong)uVar19,pcVar12,(ulong)uVar6,(ulong)uVar4,(ulong)uVar7,(ulong)uVar8,pcVar14
                  );
          }
          uVar21 = uVar21 + 1;
        } while (uVar17 != uVar21);
        uVar17 = (ulong)local_3c;
      }
    }
    printf("%-*s                Instance = %8d   Area = %10.2f   %6.2f %%   AbsDiff = %d\n",dVar24,
           0x4059000000000000,(ulong)uVar19,"TOTAL",(ulong)local_5c,uVar17);
    return;
  }
  bVar22 = true;
  if (AVar2 == ABC_FUNC_BDD) {
    if (pNtk->ntkType == ABC_NTK_LOGIC) {
      iVar20 = Abc_NtkBddToSop(pNtk,-1,1000000000);
      if (iVar20 == 0) {
        puts("Abc_NtkPrintGates(): Converting to SOPs has failed.");
        return;
      }
      bVar22 = false;
    }
  }
  else if ((AVar2 == ABC_FUNC_AIG) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    return;
  }
  pVVar16 = pNtk->vObjs;
  if (pVVar16->nSize < 1) {
    iVar20 = 0;
    iVar5 = 0;
    iVar1 = 0;
    local_60 = 0;
    uVar4 = 0;
    uVar19 = 0;
    uVar6 = 0;
  }
  else {
    lVar18 = 0;
    uVar6 = 0;
    uVar19 = 0;
    uVar4 = 0;
    local_60 = 0;
    iVar1 = 0;
    iVar5 = 0;
    iVar20 = 0;
    do {
      plVar3 = (long *)pVVar16->pArray[lVar18];
      if ((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) {
        if ((*(int *)(*plVar3 + 4) == 4) && (*(int *)((long)plVar3 + 0x1c) == 1)) {
          bVar23 = plVar3[7] == 0;
        }
        else {
          bVar23 = false;
        }
        if ((lVar18 != 0) && (!bVar23)) {
          pMVar15 = (Mio_Gate_t *)plVar3[7];
          if (pNtk->ntkFunc == ABC_FUNC_MAP) {
            pMVar15 = (Mio_Gate_t *)Mio_GateReadSop(pMVar15);
          }
          iVar9 = Abc_SopIsConst0((char *)pMVar15);
          if ((iVar9 == 0) && (iVar9 = Abc_SopIsConst1((char *)pMVar15), iVar9 == 0)) {
            iVar9 = Abc_SopIsBuf((char *)pMVar15);
            if (iVar9 == 0) {
              iVar9 = Abc_SopIsInv((char *)pMVar15);
              if (iVar9 == 0) {
                iVar9 = Abc_SopIsComplement((char *)pMVar15);
                if (((iVar9 == 0) && (iVar9 = Abc_SopIsAndType((char *)pMVar15), iVar9 != 0)) ||
                   ((iVar9 = Abc_SopIsComplement((char *)pMVar15), iVar9 != 0 &&
                    (iVar9 = Abc_SopIsOrType((char *)pMVar15), iVar9 != 0)))) {
                  iVar5 = iVar5 + 1;
                }
                else {
                  iVar9 = Abc_SopIsComplement((char *)pMVar15);
                  if (((iVar9 == 0) || (iVar9 = Abc_SopIsAndType((char *)pMVar15), iVar9 == 0)) &&
                     ((iVar9 = Abc_SopIsComplement((char *)pMVar15), iVar9 != 0 ||
                      (iVar9 = Abc_SopIsOrType((char *)pMVar15), iVar9 == 0)))) {
                    local_60 = local_60 + 1;
                  }
                  else {
                    iVar1 = iVar1 + 1;
                  }
                }
              }
              else {
                iVar20 = iVar20 + 1;
              }
            }
            else {
              uVar19 = uVar19 + 1;
            }
          }
          else {
            uVar6 = uVar6 + 1;
          }
          uVar4 = uVar4 + 1;
          pVVar16 = pNtk->vObjs;
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < pVVar16->nSize);
  }
  dVar24 = (double)(int)uVar4;
  printf("Const        = %8d    %6.2f %%\n",((double)(int)uVar6 * 100.0) / dVar24,(ulong)uVar6);
  printf("Buffer       = %8d    %6.2f %%\n",((double)(int)uVar19 * 100.0) / dVar24,(ulong)uVar19);
  printf("Inverter     = %8d    %6.2f %%\n",((double)iVar20 * 100.0) / dVar24);
  printf("And          = %8d    %6.2f %%\n",((double)iVar5 * 100.0) / dVar24);
  printf("Or           = %8d    %6.2f %%\n",((double)iVar1 * 100.0) / dVar24);
  printf("Other        = %8d    %6.2f %%\n",((double)local_60 * 100.0) / dVar24);
  printf("TOTAL        = %8d    %6.2f %%\n",(dVar24 * 100.0) / dVar24,(ulong)uVar4);
  if (bVar22) {
    return;
  }
  Abc_NtkSopToBdd(pNtk);
  return;
}

Assistant:

void Abc_NtkPrintGates( Abc_Ntk_t * pNtk, int fUseLibrary, int fUpdateProfile )
{
    Abc_Obj_t * pObj;
    int fHasBdds, i;
    int CountConst, CountBuf, CountInv, CountAnd, CountOr, CountOther, CounterTotal, TotalDiff = 0;
    char * pSop;

    if ( fUseLibrary && Abc_NtkHasMapping(pNtk) )
    {
        Mio_Gate_t ** ppGates;
        double Area, AreaTotal;
        int Counter, nGates, i, nGateNameLen;

        // clean value of all gates
        nGates = Mio_LibraryReadGateNum( (Mio_Library_t *)pNtk->pManFunc );
        ppGates = Mio_LibraryReadGateArray( (Mio_Library_t *)pNtk->pManFunc );
        for ( i = 0; i < nGates; i++ )
        {
            Mio_GateSetValue( ppGates[i], 0 );
            if ( fUpdateProfile )
                Mio_GateSetProfile2( ppGates[i], 0 );
        }

        // count the gates by name
        CounterTotal = 0;
        Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
        {
            if ( i == 0 ) continue;
            Mio_GateSetValue( (Mio_Gate_t *)pObj->pData, 1 + Mio_GateReadValue((Mio_Gate_t *)pObj->pData) );
            if ( fUpdateProfile )
                Mio_GateIncProfile2( (Mio_Gate_t *)pObj->pData );
            CounterTotal++;
            // assuming that twin gates follow each other
            if ( Abc_NtkFetchTwinNode(pObj) )
                i++;
        }

        // determine the longest gate name
        nGateNameLen = 5;
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 )
                continue;
            nGateNameLen = Abc_MaxInt( nGateNameLen, strlen(Mio_GateReadName(ppGates[i])) );
        }

        // print the gates
        AreaTotal = Abc_NtkGetMappedArea(pNtk);
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 && Mio_GateReadProfile(ppGates[i]) == 0 )
                continue;
            if ( Mio_GateReadPinNum(ppGates[i]) > 1 )
                TotalDiff += Abc_AbsInt( Mio_GateReadProfile(ppGates[i]) - Mio_GateReadProfile2(ppGates[i]) );
            Area = Counter * Mio_GateReadArea( ppGates[i] );
            printf( "%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%   %8d  %8d   %s\n",
                nGateNameLen, Mio_GateReadName( ppGates[i] ),
                Mio_GateReadPinNum( ppGates[i] ),
                Counter, Area, 100.0 * Area / AreaTotal,
                Mio_GateReadProfile(ppGates[i]),
                Mio_GateReadProfile2(ppGates[i]),
                Mio_GateReadForm(ppGates[i]) );
        }
        printf( "%-*s                Instance = %8d   Area = %10.2f   %6.2f %%   AbsDiff = %d\n",
            nGateNameLen, "TOTAL",
            CounterTotal, AreaTotal, 100.0, TotalDiff );
        return;
    }

    if ( Abc_NtkIsAigLogic(pNtk) )
        return;

    // transform logic functions from BDD to SOP
    if ( (fHasBdds = Abc_NtkIsBddLogic(pNtk)) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Abc_NtkPrintGates(): Converting to SOPs has failed.\n" );
            return;
        }
    }

    // get hold of the SOP of the node
    CountConst = CountBuf = CountInv = CountAnd = CountOr = CountOther = CounterTotal = 0;
    Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        if ( Abc_NtkHasMapping(pNtk) )
            pSop = Mio_GateReadSop((Mio_Gate_t *)pObj->pData);
        else
            pSop = (char *)pObj->pData;
        // collect the stats
        if ( Abc_SopIsConst0(pSop) || Abc_SopIsConst1(pSop) )
            CountConst++;
        else if ( Abc_SopIsBuf(pSop) )
            CountBuf++;
        else if ( Abc_SopIsInv(pSop) )
            CountInv++;
        else if ( (!Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  ( Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountAnd++;
        else if ( ( Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  (!Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountOr++;
        else
            CountOther++;
        CounterTotal++;
    }
    printf( "Const        = %8d    %6.2f %%\n", CountConst  ,  100.0 * CountConst   / CounterTotal );
    printf( "Buffer       = %8d    %6.2f %%\n", CountBuf    ,  100.0 * CountBuf     / CounterTotal );
    printf( "Inverter     = %8d    %6.2f %%\n", CountInv    ,  100.0 * CountInv     / CounterTotal );
    printf( "And          = %8d    %6.2f %%\n", CountAnd    ,  100.0 * CountAnd     / CounterTotal );
    printf( "Or           = %8d    %6.2f %%\n", CountOr     ,  100.0 * CountOr      / CounterTotal );
    printf( "Other        = %8d    %6.2f %%\n", CountOther  ,  100.0 * CountOther   / CounterTotal );
    printf( "TOTAL        = %8d    %6.2f %%\n", CounterTotal,  100.0 * CounterTotal / CounterTotal );

    // convert the network back into BDDs if this is how it was
    if ( fHasBdds )
        Abc_NtkSopToBdd(pNtk);
}